

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall CLPIParser::composeExtentStartPoint(CLPIParser *this,BitStreamWriter *writer)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  int *piVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar10;
  int iVar11;
  uint value;
  int iVar12;
  int *i;
  int *piVar13;
  int local_50;
  
  puVar3 = (writer->super_BitStream).m_buffer;
  puVar4 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  value = 0;
  BitStreamWriter::putBits(writer,0x20,0);
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x10,0);
  BitStreamWriter::putBits
            (writer,0x10,
             (uint)((ulong)((long)(this->interleaveInfo).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->interleaveInfo).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2));
  piVar7 = (this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar13 = (this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; piVar13 != piVar7; piVar13 = piVar13 + 1) {
    value = value + *piVar13;
    BitStreamWriter::putBits(writer,0x20,value);
  }
  local_50 = (int)puVar6;
  local_50 = (int)puVar5 - local_50;
  iVar8 = uVar2 + local_50 * 8;
  iVar12 = (int)puVar3 - (int)puVar4;
  iVar10 = uVar1 + iVar12 * 8;
  iVar11 = uVar2 + local_50 * 8 + 7;
  if (-1 < iVar8) {
    iVar11 = iVar8;
  }
  iVar8 = uVar1 + iVar12 * 8 + 7;
  if (-1 < iVar10) {
    iVar8 = iVar10;
  }
  iVar12 = *(int *)&(writer->super_BitStream).m_buffer -
           *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar10 = writer->m_bitWrited + iVar12 * 8;
  iVar12 = writer->m_bitWrited + iVar12 * 8 + 7;
  if (-1 < iVar10) {
    iVar12 = iVar10;
  }
  uVar9 = my_ntohl((iVar12 >> 3) - (iVar11 >> 3));
  *(uint32_t *)((long)puVar4 + (long)(iVar8 >> 3)) = uVar9;
  return;
}

Assistant:

void CLPIParser::composeExtentStartPoint(BitStreamWriter& writer) const
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(16, 0);  // reserved
    writer.putBits(16, static_cast<unsigned>(interleaveInfo.size()));

    uint32_t sum = 0;
    for (const auto& i : interleaveInfo)
    {
        sum += i;
        writer.putBits(32, sum);
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}